

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O1

void __thiscall
Diligent::RayTracingPipelineStateCreateInfoX::RayTracingPipelineStateCreateInfoX
          (RayTracingPipelineStateCreateInfoX *this,RayTracingPipelineStateCreateInfo *_Desc)

{
  RayTracingGeneralShaderGroup *pRVar1;
  RayTracingTriangleHitShaderGroup *pRVar2;
  RayTracingProceduralHitShaderGroup *pRVar3;
  ulong uVar4;
  
  PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ::PipelineStateCreateInfoX
            (&this->
              super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
             ,_Desc);
  (this->ShaderObjects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ShaderObjects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ProceduralHitShaders).
  super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ShaderObjects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ProceduralHitShaders).
  super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ProceduralHitShaders).
  super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TriangleHitShaders).
  super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TriangleHitShaders).
  super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->GeneralShaders).
  super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TriangleHitShaders).
  super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GeneralShaders).
  super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GeneralShaders).
  super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = (ulong)(this->
                 super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                 ).super_RayTracingPipelineStateCreateInfo.GeneralShaderCount;
  if (uVar4 != 0) {
    pRVar1 = (this->
             super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
             ).super_RayTracingPipelineStateCreateInfo.pGeneralShaders;
    std::
    vector<Diligent::RayTracingGeneralShaderGroup,std::allocator<Diligent::RayTracingGeneralShaderGroup>>
    ::_M_assign_aux<Diligent::RayTracingGeneralShaderGroup_const*>
              ((vector<Diligent::RayTracingGeneralShaderGroup,std::allocator<Diligent::RayTracingGeneralShaderGroup>>
                *)&this->GeneralShaders,pRVar1,pRVar1 + uVar4);
  }
  uVar4 = (ulong)(this->
                 super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                 ).super_RayTracingPipelineStateCreateInfo.TriangleHitShaderCount;
  if (uVar4 != 0) {
    pRVar2 = (this->
             super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
             ).super_RayTracingPipelineStateCreateInfo.pTriangleHitShaders;
    std::
    vector<Diligent::RayTracingTriangleHitShaderGroup,std::allocator<Diligent::RayTracingTriangleHitShaderGroup>>
    ::_M_assign_aux<Diligent::RayTracingTriangleHitShaderGroup_const*>
              ((vector<Diligent::RayTracingTriangleHitShaderGroup,std::allocator<Diligent::RayTracingTriangleHitShaderGroup>>
                *)&this->TriangleHitShaders,pRVar2,pRVar2 + uVar4);
  }
  uVar4 = (ulong)(this->
                 super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                 ).super_RayTracingPipelineStateCreateInfo.ProceduralHitShaderCount;
  if (uVar4 != 0) {
    pRVar3 = (this->
             super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
             ).super_RayTracingPipelineStateCreateInfo.pProceduralHitShaders;
    std::
    vector<Diligent::RayTracingProceduralHitShaderGroup,std::allocator<Diligent::RayTracingProceduralHitShaderGroup>>
    ::_M_assign_aux<Diligent::RayTracingProceduralHitShaderGroup_const*>
              ((vector<Diligent::RayTracingProceduralHitShaderGroup,std::allocator<Diligent::RayTracingProceduralHitShaderGroup>>
                *)&this->ProceduralHitShaders,pRVar3,pRVar3 + uVar4);
  }
  SyncDesc(this,SYNC_FLAG_ALL);
  return;
}

Assistant:

RayTracingPipelineStateCreateInfoX(const RayTracingPipelineStateCreateInfo& _Desc) :
        PipelineStateCreateInfoX{_Desc}
    {
        if (GeneralShaderCount != 0)
            GeneralShaders.assign(pGeneralShaders, pGeneralShaders + GeneralShaderCount);

        if (TriangleHitShaderCount != 0)
            TriangleHitShaders.assign(pTriangleHitShaders, pTriangleHitShaders + TriangleHitShaderCount);

        if (ProceduralHitShaderCount != 0)
            ProceduralHitShaders.assign(pProceduralHitShaders, pProceduralHitShaders + ProceduralHitShaderCount);

        SyncDesc(SYNC_FLAG_ALL);
    }